

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  string *tested_snippet;
  long lVar1;
  allocator<char> local_cc;
  allocator<char> local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  string array_declaration;
  string case_specific_string [4];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&array_declaration,"    int x[4][3][2][1];\n\n",
             (allocator<char> *)case_specific_string);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)case_specific_string,
             "    if (x.length() != 4) {\n        result = 0.0f;\n    }\n",&local_c9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(case_specific_string + 1),
             "    if (x[0].length() != 3) {\n        result = 0.0f;\n    }\n",&local_ca);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(case_specific_string + 2),
             "    if (x[0][0].length() != 2) {\n        result = 0.0f;\n    }\n",&local_cb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(case_specific_string + 3),
             "    if (x[0][0][0].length() != 1) {\n        result = 0.0f;\n    }\n",&local_cc);
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x20) {
    tested_snippet = (string *)((long)&case_specific_string[0]._M_dataplus._M_p + lVar1);
    if (tested_shader_type == COMPUTE_SHADER_TYPE) {
      execute_dispatch_test(this,COMPUTE_SHADER_TYPE,&array_declaration,tested_snippet);
    }
    else {
      execute_draw_test(this,tested_shader_type,&array_declaration,tested_snippet);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[5])(this);
  }
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string
              ((string *)((long)&case_specific_string[0]._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)&array_declaration);
  return;
}

Assistant:

void ExpressionsLength1<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string array_declaration	  = "    int x[4][3][2][1];\n\n";
	std::string case_specific_string[] = { "    if (x.length() != 4) {\n"
										   "        result = 0.0f;\n    }\n",
										   "    if (x[0].length() != 3) {\n"
										   "        result = 0.0f;\n    }\n",
										   "    if (x[0][0].length() != 2) {\n"
										   "        result = 0.0f;\n    }\n",
										   "    if (x[0][0][0].length() != 1) {\n"
										   "        result = 0.0f;\n    }\n" };
	const bool test_compute = (TestCaseBase<API>::COMPUTE_SHADER_TYPE == tested_shader_type);

	for (size_t case_specific_string_index = 0;
		 case_specific_string_index < sizeof(case_specific_string) / sizeof(case_specific_string[0]);
		 case_specific_string_index++)
	{
		const std::string& test_snippet = case_specific_string[case_specific_string_index];

		if (false == test_compute)
		{
			execute_draw_test(tested_shader_type, array_declaration, test_snippet);
		}
		else
		{
			execute_dispatch_test(tested_shader_type, array_declaration, test_snippet);
		}

		/* Deallocate any resources used. */
		this->delete_objects();
	} /* for (int case_specific_string_index = 0; ...) */
}